

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS
ref_mpi_blindsend(REF_MPI ref_mpi,REF_INT *proc,void *send,REF_INT ldim,REF_INT nsend,void **recv,
                 REF_INT *nrecv,REF_TYPE type)

{
  size_t __size;
  REF_STATUS RVar1;
  REF_INT *send_size;
  ulong uVar2;
  REF_INT *recv_size;
  undefined4 *__ptr;
  void *pvVar3;
  void *recv_00;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  
  *recv = (void *)0x0;
  uVar12 = (ulong)ref_mpi->n;
  if ((long)uVar12 < 2) {
    *nrecv = nsend;
    if (type == 3) {
      uVar11 = nsend * ldim;
      if ((int)uVar11 < 0) {
        pcVar10 = "malloc *((REF_DBL **)recv) of REF_DBL negative";
        uVar5 = 0x445;
        goto LAB_001ff526;
      }
      pvVar3 = malloc((ulong)uVar11 * 8);
      *recv = pvVar3;
      if (pvVar3 != (void *)0x0) {
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          *(undefined8 *)((long)pvVar3 + uVar12 * 8) = *(undefined8 *)((long)send + uVar12 * 8);
        }
        return 0;
      }
      pcVar10 = "malloc *((REF_DBL **)recv) of REF_DBL NULL";
      uVar5 = 0x445;
    }
    else if (type == 2) {
      uVar11 = nsend * ldim;
      if ((int)uVar11 < 0) {
        pcVar10 = "malloc *((REF_LONG **)recv) of REF_LONG negative";
        uVar5 = 0x43f;
        goto LAB_001ff526;
      }
      pvVar3 = malloc((ulong)uVar11 * 8);
      *recv = pvVar3;
      if (pvVar3 != (void *)0x0) {
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          *(undefined8 *)((long)pvVar3 + uVar12 * 8) = *(undefined8 *)((long)send + uVar12 * 8);
        }
        return 0;
      }
      pcVar10 = "malloc *((REF_LONG **)recv) of REF_LONG NULL";
      uVar5 = 0x43f;
    }
    else {
      if (type != 1) {
        pcVar10 = "data type";
        RVar1 = 6;
        uVar5 = 1099;
        goto LAB_001ff391;
      }
      uVar11 = nsend * ldim;
      if ((int)uVar11 < 0) {
        pcVar10 = "malloc *((REF_INT **)recv) of REF_INT negative";
        uVar5 = 0x439;
        goto LAB_001ff526;
      }
      pvVar3 = malloc((ulong)uVar11 * 4);
      *recv = pvVar3;
      if (pvVar3 != (void *)0x0) {
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          *(undefined4 *)((long)pvVar3 + uVar12 * 4) = *(undefined4 *)((long)send + uVar12 * 4);
        }
        return 0;
      }
      pcVar10 = "malloc *((REF_INT **)recv) of REF_INT NULL";
      uVar5 = 0x439;
    }
  }
  else {
    __size = uVar12 * 4;
    send_size = (REF_INT *)malloc(__size);
    if (send_size == (REF_INT *)0x0) {
      pcVar10 = "malloc a_size of REF_INT NULL";
      uVar5 = 0x450;
    }
    else {
      for (uVar2 = 0; uVar12 != uVar2; uVar2 = uVar2 + 1) {
        send_size[uVar2] = 0;
      }
      recv_size = (REF_INT *)malloc(__size);
      if (recv_size == (REF_INT *)0x0) {
        pcVar10 = "malloc b_size of REF_INT NULL";
        uVar5 = 0x451;
      }
      else {
        for (uVar2 = 0; uVar12 != uVar2; uVar2 = uVar2 + 1) {
          recv_size[uVar2] = 0;
        }
        uVar8 = 0;
        uVar2 = (ulong)(uint)nsend;
        if (nsend < 1) {
          uVar2 = uVar8;
        }
        for (; uVar2 != uVar8; uVar8 = uVar8 + 1) {
          send_size[proc[uVar8]] = send_size[proc[uVar8]] + 1;
        }
        *recv_size = *send_size;
        iVar6 = 0;
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          iVar6 = iVar6 + send_size[uVar8];
        }
        iVar7 = 0;
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          iVar7 = iVar7 + recv_size[uVar8];
        }
        __ptr = (undefined4 *)malloc(__size);
        if (__ptr != (undefined4 *)0x0) {
          *__ptr = 0;
          iVar4 = 0;
          for (uVar8 = 1; uVar8 < uVar12; uVar8 = uVar8 + 1) {
            iVar4 = iVar4 + send_size[uVar8 - 1];
            __ptr[uVar8] = iVar4;
          }
          *recv = (void *)0x0;
          if (type == 3) {
            if (iVar6 * ldim < 0) {
              pcVar10 = "malloc a_data of REF_DBL negative";
              uVar5 = 0x47b;
LAB_001ff526:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                     ,uVar5,"ref_mpi_blindsend",pcVar10);
              return 1;
            }
            pvVar3 = malloc((ulong)(uint)(iVar6 * ldim) << 3);
            if (pvVar3 == (void *)0x0) {
              pcVar10 = "malloc a_data of REF_DBL NULL";
              uVar5 = 0x47b;
              goto LAB_001ff72c;
            }
            if (iVar7 * ldim < 0) {
              pcVar10 = "malloc *((REF_DBL **)recv) of REF_DBL negative";
              uVar5 = 0x47c;
              goto LAB_001ff526;
            }
            recv_00 = malloc((ulong)(uint)(iVar7 * ldim) << 3);
            *recv = recv_00;
            if (recv_00 == (void *)0x0) {
              pcVar10 = "malloc *((REF_DBL **)recv) of REF_DBL NULL";
              uVar5 = 0x47c;
              goto LAB_001ff72c;
            }
            uVar12 = 0;
            uVar8 = 0;
            if (0 < ldim) {
              uVar8 = (ulong)(uint)ldim;
            }
            for (; uVar12 != uVar2; uVar12 = uVar12 + 1) {
              for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                *(undefined8 *)
                 ((long)pvVar3 + uVar9 * 8 + (long)(int)__ptr[proc[uVar12]] * (long)ldim * 8) =
                     *(undefined8 *)((long)send + uVar9 * 8);
              }
              __ptr[proc[uVar12]] = __ptr[proc[uVar12]] + 1;
              send = (void *)((long)send + (long)ldim * 8);
            }
          }
          else if (type == 2) {
            if (iVar6 * ldim < 0) {
              pcVar10 = "malloc a_data of REF_LONG negative";
              uVar5 = 0x471;
              goto LAB_001ff526;
            }
            pvVar3 = malloc((ulong)(uint)(iVar6 * ldim) << 3);
            if (pvVar3 == (void *)0x0) {
              pcVar10 = "malloc a_data of REF_LONG NULL";
              uVar5 = 0x471;
              goto LAB_001ff72c;
            }
            if (iVar7 * ldim < 0) {
              pcVar10 = "malloc *((REF_LONG **)recv) of REF_LONG negative";
              uVar5 = 0x472;
              goto LAB_001ff526;
            }
            recv_00 = malloc((ulong)(uint)(iVar7 * ldim) << 3);
            *recv = recv_00;
            if (recv_00 == (void *)0x0) {
              pcVar10 = "malloc *((REF_LONG **)recv) of REF_LONG NULL";
              uVar5 = 0x472;
              goto LAB_001ff72c;
            }
            uVar12 = 0;
            uVar8 = 0;
            if (0 < ldim) {
              uVar8 = (ulong)(uint)ldim;
            }
            for (; uVar12 != uVar2; uVar12 = uVar12 + 1) {
              for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                *(undefined8 *)
                 ((long)pvVar3 + uVar9 * 8 + (long)(int)__ptr[proc[uVar12]] * (long)ldim * 8) =
                     *(undefined8 *)((long)send + uVar9 * 8);
              }
              __ptr[proc[uVar12]] = __ptr[proc[uVar12]] + 1;
              send = (void *)((long)send + (long)ldim * 8);
            }
          }
          else {
            if (type != 1) {
              pcVar10 = "data type";
              RVar1 = 6;
              uVar5 = 0x485;
              goto LAB_001ff391;
            }
            if (iVar6 * ldim < 0) {
              pcVar10 = "malloc a_data of REF_INT negative";
              uVar5 = 0x467;
              goto LAB_001ff526;
            }
            pvVar3 = malloc((ulong)(uint)(iVar6 * ldim) << 2);
            if (pvVar3 == (void *)0x0) {
              pcVar10 = "malloc a_data of REF_INT NULL";
              uVar5 = 0x467;
              goto LAB_001ff72c;
            }
            if (iVar7 * ldim < 0) {
              pcVar10 = "malloc *((REF_INT **)recv) of REF_INT negative";
              uVar5 = 0x468;
              goto LAB_001ff526;
            }
            recv_00 = malloc((ulong)(uint)(iVar7 * ldim) << 2);
            *recv = recv_00;
            if (recv_00 == (void *)0x0) {
              pcVar10 = "malloc *((REF_INT **)recv) of REF_INT NULL";
              uVar5 = 0x468;
              goto LAB_001ff72c;
            }
            uVar12 = 0;
            uVar8 = 0;
            if (0 < ldim) {
              uVar8 = (ulong)(uint)ldim;
            }
            for (; uVar12 != uVar2; uVar12 = uVar12 + 1) {
              for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                *(undefined4 *)
                 ((long)pvVar3 + uVar9 * 4 + (long)(int)__ptr[proc[uVar12]] * (long)ldim * 4) =
                     *(undefined4 *)((long)send + uVar9 * 4);
              }
              __ptr[proc[uVar12]] = __ptr[proc[uVar12]] + 1;
              send = (void *)((long)send + (long)ldim * 4);
            }
          }
          RVar1 = ref_mpi_alltoallv(ref_mpi,pvVar3,send_size,recv_00,recv_size,ldim,type);
          if (RVar1 == 0) {
            *nrecv = iVar7;
            free(__ptr);
            free(pvVar3);
            free(recv_size);
            free(send_size);
            return 0;
          }
          pcVar10 = "alltoallv global";
          uVar5 = 0x489;
LAB_001ff391:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                 uVar5,"ref_mpi_blindsend",RVar1,pcVar10);
          return RVar1;
        }
        pcVar10 = "malloc a_next of REF_INT NULL";
        uVar5 = 0x45e;
      }
    }
  }
LAB_001ff72c:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar5,
         "ref_mpi_blindsend",pcVar10);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_blindsend(REF_MPI ref_mpi, REF_INT *proc, void *send,
                                     REF_INT ldim, REF_INT nsend, void **recv,
                                     REF_INT *nrecv, REF_TYPE type) {
  REF_INT i, l, part;
  REF_INT *a_size, *b_size;
  REF_INT *a_next;
  REF_INT a_total, b_total;

  void *a_data;

  a_data = NULL;
  *recv = NULL;

  if (!ref_mpi_para(ref_mpi)) {
    *nrecv = nsend;
    switch (type) {
      case REF_INT_TYPE:
        ref_malloc(*((REF_INT **)recv), ldim * nsend, REF_INT);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_INT **)recv))[i] = ((REF_INT *)send)[i];
        }
        break;
      case REF_LONG_TYPE:
        ref_malloc(*((REF_LONG **)recv), ldim * nsend, REF_LONG);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_LONG **)recv))[i] = ((REF_LONG *)send)[i];
        }
        break;
      case REF_DBL_TYPE:
        ref_malloc(*((REF_DBL **)recv), ldim * nsend, REF_DBL);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_DBL **)recv))[i] = ((REF_DBL *)send)[i];
        }
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
    return REF_SUCCESS;
  }

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (i = 0; i < nsend; i++) a_size[proc[i]]++;

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  a_data = NULL;
  *recv = NULL;
  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_INT);
      ref_malloc(*((REF_INT **)recv), ldim * b_total, REF_INT);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_INT *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_INT *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    case REF_LONG_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_LONG);
      ref_malloc(*((REF_LONG **)recv), ldim * b_total, REF_LONG);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_LONG *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_LONG *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    case REF_DBL_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_DBL);
      ref_malloc(*((REF_DBL **)recv), ldim * b_total, REF_DBL);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_DBL *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_DBL *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_data, a_size, *recv, b_size, ldim, type),
      "alltoallv global");

  *nrecv = b_total;

  ref_free(a_next);
  ref_free(a_data);
  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}